

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::count(Forth *this)

{
  byte bVar1;
  uint pointer;
  Cell count;
  CAddr caddr;
  Forth *this_local;
  
  requireDStackDepth(this,1,"COUNT");
  requireDStackAvailable(this,1,"COUNT");
  pointer = ForthStack<unsigned_int>::getTop(&this->dStack);
  bVar1 = getDataChar(this,pointer);
  ForthStack<unsigned_int>::setTop(&this->dStack,pointer + 1);
  push(this,(uint)bVar1);
  return;
}

Assistant:

void count() {
			REQUIRE_DSTACK_DEPTH(1, "COUNT");
			REQUIRE_DSTACK_AVAILABLE(1, "COUNT");
			auto caddr = CADDR(dStack.getTop());
			auto count = static_cast<Cell>(getDataChar(caddr));
			dStack.setTop(CELL(caddr + 1));
			push(count);
		}